

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::HasMacOSXRpathInstallNameDir(cmGeneratorTarget *this,string *config)

{
  pointer pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ImportInfo *pIVar6;
  long lVar7;
  size_t sVar8;
  cmake *this_01;
  cmListFileBacktrace *r;
  char *pcVar9;
  string install_name;
  string local_1e0;
  cmListFileBacktrace local_1c0;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  if (this->Target->IsImportedTarget == false) {
    if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
      pcVar1 = local_1a0 + 0x10;
      local_1a0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"INSTALL_NAME_DIR","");
      pcVar9 = GetProperty(this,(string *)local_1a0);
      if ((pointer)local_1a0._0_8_ != pcVar1) {
        operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
      }
      bVar2 = MacOSXUseInstallNameDir(this);
      bVar4 = pcVar9 == (char *)0x0;
      if (!bVar4 && bVar2) {
        local_1a0._0_8_ = pcVar1;
        sVar8 = strlen(pcVar9);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,pcVar9,pcVar9 + sVar8);
        iVar5 = std::__cxx11::string::compare((char *)local_1a0);
        if ((pointer)local_1a0._0_8_ != pcVar1) {
          operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
        }
        bVar3 = false;
        bVar4 = false;
        if (iVar5 == 0) goto LAB_0049120e;
      }
      if ((bVar4 || !bVar2) && (bVar3 = MacOSXRpathInstallNameDirDefault(this), bVar3))
      goto LAB_0049120e;
    }
  }
  else {
    pIVar6 = GetImportInfo(this,config);
    if (pIVar6 != (ImportInfo *)0x0) {
      if ((pIVar6->NoSOName == false) && ((pIVar6->SOName)._M_string_length != 0)) {
        bVar3 = false;
        lVar7 = std::__cxx11::string::find((char *)&pIVar6->SOName,0x657cd4,0);
        if (lVar7 != 0) {
          return false;
        }
      }
      else {
        local_1a0._8_8_ = 0;
        local_1a0[0x10] = '\0';
        local_1a0._0_8_ = local_1a0 + 0x10;
        cmSystemTools::GuessLibraryInstallName(&pIVar6->Location,(string *)local_1a0);
        lVar7 = std::__cxx11::string::find(local_1a0,0x652c3d,0);
        if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
          operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
        }
        bVar3 = false;
        if (lVar7 == -1) {
          return false;
        }
      }
LAB_0049120e:
      this_00 = this->Makefile;
      local_1a0._0_8_ = local_1a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG","");
      bVar4 = cmMakefile::IsSet(this_00,(string *)local_1a0);
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
      }
      if (bVar4) {
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Attempting to use ",0x12);
      pcVar9 = "@rpath";
      if (bVar3 != false) {
        pcVar9 = "MACOSX_RPATH";
      }
      lVar7 = 6;
      if (bVar3 != false) {
        lVar7 = 0xc;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar9,lVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0," without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.",0x37
                );
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"  This could be because you are using a Mac OS X version",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 " less than 10.5 or because CMake\'s platform configuration is",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," corrupt.",9);
      this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::stringbuf::str();
      r = cmTarget::GetBacktrace(this->Target);
      cmListFileBacktrace::cmListFileBacktrace(&local_1c0,r);
      cmake::IssueMessage(this_01,FATAL_ERROR,&local_1e0,&local_1c0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::HasMacOSXRpathInstallNameDir(
  const std::string& config) const
{
  bool install_name_is_rpath = false;
  bool macosx_rpath = false;

  if (!this->IsImported()) {
    if (this->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return false;
    }
    const char* install_name = this->GetProperty("INSTALL_NAME_DIR");
    bool use_install_name = this->MacOSXUseInstallNameDir();
    if (install_name && use_install_name &&
        std::string(install_name) == "@rpath") {
      install_name_is_rpath = true;
    } else if (install_name && use_install_name) {
      return false;
    }
    if (!install_name_is_rpath) {
      macosx_rpath = this->MacOSXRpathInstallNameDirDefault();
    }
  } else {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (!info->NoSOName && !info->SOName.empty()) {
        if (info->SOName.find("@rpath/") == 0) {
          install_name_is_rpath = true;
        }
      } else {
        std::string install_name;
        cmSystemTools::GuessLibraryInstallName(info->Location, install_name);
        if (install_name.find("@rpath") != std::string::npos) {
          install_name_is_rpath = true;
        }
      }
    }
  }

  if (!install_name_is_rpath && !macosx_rpath) {
    return false;
  }

  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    std::ostringstream w;
    w << "Attempting to use ";
    if (macosx_rpath) {
      w << "MACOSX_RPATH";
    } else {
      w << "@rpath";
    }
    w << " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.";
    w << "  This could be because you are using a Mac OS X version";
    w << " less than 10.5 or because CMake's platform configuration is";
    w << " corrupt.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(cmake::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return true;
}